

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

void __thiscall
soplex::SLUFactor<double>::solveLeft
          (SLUFactor<double> *this,SSVectorBase<double> *x,SSVectorBase<double> *y,
          SSVectorBase<double> *z,SVectorBase<double> *rhs1,SSVectorBase<double> *rhs2,
          SSVectorBase<double> *rhs3)

{
  int *idx;
  double *vec;
  int *idx3;
  int *ridx3;
  double *rhs3_00;
  int n3;
  SVectorBase<double> *local_90;
  int n2;
  int n1;
  double *local_80;
  int *local_78;
  double *local_70;
  int *local_68;
  CLUFactor<double> *local_60;
  Real local_58;
  pointer local_50;
  int *local_48;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_90 = rhs1;
  (*this->solveTime->_vptr_Timer[3])();
  local_48 = (this->ssvec).super_IdxSet.idx;
  local_50 = (this->ssvec).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
  (this->ssvec).setupStatus = false;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &(this->super_CLUFactor<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  local_58 = Tolerances::epsilon(local_40._M_ptr);
  local_60 = &this->super_CLUFactor<double>;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  SSVectorBase<double>::clear(x);
  SSVectorBase<double>::clear(y);
  SSVectorBase<double>::clear(z);
  SSVectorBase<double>::assign<double>(&this->ssvec,local_90);
  n1 = (this->ssvec).super_IdxSet.num;
  n2 = (rhs2->super_IdxSet).num;
  n3 = (rhs3->super_IdxSet).num;
  idx = (x->super_IdxSet).idx;
  vec = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start;
  x->setupStatus = false;
  local_68 = (y->super_IdxSet).idx;
  local_90 = (SVectorBase<double> *)
             (y->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
  y->setupStatus = false;
  local_78 = (rhs2->super_IdxSet).idx;
  local_70 = (rhs2->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
  rhs2->setupStatus = false;
  idx3 = (z->super_IdxSet).idx;
  local_80 = (z->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
  z->setupStatus = false;
  ridx3 = (rhs3->super_IdxSet).idx;
  rhs3_00 = (rhs3->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_start;
  rhs3->setupStatus = false;
  CLUFactor<double>::vSolveLeft3sparse
            (local_60,local_58,vec,idx,local_50,local_48,&n1,(double *)local_90,local_68,local_70,
             local_78,&n2,local_80,idx3,rhs3_00,ridx3,&n3);
  x->setupStatus = false;
  (x->super_IdxSet).num = n1;
  y->setupStatus = false;
  (y->super_IdxSet).num = n2;
  z->setupStatus = false;
  (z->super_IdxSet).num = n3;
  if (0 < n1) {
    x->setupStatus = true;
  }
  if (0 < n2) {
    y->setupStatus = true;
  }
  if (0 < n3) {
    z->setupStatus = true;
  }
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 3;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solveLeft(
   SSVectorBase<R>&       x,
   SSVectorBase<R>&       y,
   SSVectorBase<R>&       z,
   const SVectorBase<R>& rhs1,
   SSVectorBase<R>&       rhs2,
   SSVectorBase<R>&       rhs3)
{

   solveTime->start();

   int   n1, n2, n3;
   R* svec = ssvec.altValues();
   int*  sidx = ssvec.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   z.clear();
   ssvec.assign(rhs1);
   n1 = ssvec.size(); // see altValues();
   n2 = rhs2.size();
   n3 = rhs3.size();
   this->vSolveLeft3sparse(epsilon,
                           x.altValues(), x.altIndexMem(),
                           svec, sidx, n1,
                           y.altValues(), y.altIndexMem(),
                           rhs2.altValues(), rhs2.altIndexMem(), n2,
                           z.altValues(), z.altIndexMem(),
                           rhs3.altValues(), rhs3.altIndexMem(), n3);
   x.setSize(n1);
   y.setSize(n2);
   z.setSize(n3);

   if(n1 > 0)
      x.forceSetup();

   if(n2 > 0)
      y.forceSetup();

   if(n3 > 0)
      z.forceSetup();

   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 3;
   solveTime->stop();
}